

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSA.h
# Opt level: O1

int __thiscall
RSA::decrypt_abi_cxx11_
          (RSA *this,EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  Conversion *pCVar3;
  char *pcVar4;
  char *pcVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  BigInt cipher;
  set<char,_std::less<char>,_std::allocator<char>_> vocab_set;
  string local_d0;
  BigInt local_b0;
  BigInt local_90;
  BigInt local_70;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_50;
  
  std::set<char,std::less<char>,std::allocator<char>>::
  set<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((set<char,std::less<char>,std::allocator<char>> *)&local_50,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )*(char **)(ctx + 8),
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(*(char **)(ctx + 8) + *(long *)(ctx + 0x10)));
  if (*(long *)(ctx + 0x50) != 0) {
    pcVar5 = *(char **)(ctx + 0x48);
    pcVar4 = pcVar5 + *(long *)(ctx + 0x50);
    p_Var1 = &local_50._M_impl.super__Rb_tree_header;
    do {
      cVar2 = *pcVar5;
      p_Var6 = &p_Var1->_M_header;
      for (p_Var7 = local_50._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var7 != (_Rb_tree_header *)0x0;
          p_Var7 = (&p_Var7->_M_left)[(char)*(size_t *)(p_Var7 + 1) < cVar2]) {
        if (cVar2 <= (char)*(size_t *)(p_Var7 + 1)) {
          p_Var6 = p_Var7;
        }
      }
      p_Var7 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
         (p_Var7 = p_Var6, cVar2 < (char)p_Var6[1]._M_color)) {
        p_Var7 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var7 == p_Var1) {
        std::__cxx11::string::_M_replace((ulong)(ctx + 0x48),0,*(char **)(ctx + 0x50),0x10d0a3);
        *(undefined4 *)(ctx + 0x198) = 1;
        if (*(long *)(ctx + 0x188) != *(long *)(ctx + 0x180)) {
          *(long *)(ctx + 0x188) = *(long *)(ctx + 0x180);
        }
        (this->super_Crypto)._vptr_Crypto =
             (_func_int **)&(this->super_Crypto).vocabulary._M_string_length;
        std::__cxx11::string::_M_construct<char_const*>((string *)this,"");
        goto LAB_00104bf3;
      }
      pcVar5 = pcVar5 + 1;
    } while (pcVar5 != pcVar4);
  }
  pCVar3 = *(Conversion **)(ctx + 0x1a0);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,*(long *)(ctx + 0x48),*(long *)(ctx + 0x50) + *(long *)(ctx + 0x48)
            );
  Conversion::convert_to_num_base(&local_70,pCVar3,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  pCVar3 = *(Conversion **)(ctx + 0x1a0);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (&local_b0.vector_value,(vector<long_long,_std::allocator<long_long>_> *)(ctx + 0x140));
  local_b0.sign = *(int *)(ctx + 0x158);
  BigInt::powMod(&local_90,&local_70,&local_b0,(BigInt *)(ctx + 0xe0));
  Conversion::convert_to_voacb_base_abi_cxx11_((string *)this,pCVar3,&local_90);
  if (local_90.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
LAB_00104bf3:
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::~_Rb_tree
            (&local_50);
  return (int)this;
}

Assistant:

string RSA::decrypt() {
    set<char> vocab_set(vocabulary.begin(), vocabulary.end());

    for (auto cipher_char:cipherText)
        if (vocab_set.find(cipher_char) == vocab_set.end()) {
            cipherText = "Some letter in the cipher text is not contained in vocabulary";
            cipher_BigInt = 0;
            return "";
        }
    BigInt cipher = conversion->convert_to_num_base(cipherText);

    return conversion->convert_to_voacb_base(cipher.powMod(d, n));
}